

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CryptoSystem.cpp
# Opt level: O2

KString * __thiscall
KDIS::DATA_TYPE::CryptoSystem::GetAsString_abi_cxx11_
          (KString *__return_storage_ptr__,CryptoSystem *this)

{
  ostream *poVar1;
  KINT32 Value;
  KINT32 Value_00;
  KStringStream ss;
  KString local_1e0;
  KString local_1c0;
  stringstream local_1a0 [16];
  ostream local_190 [376];
  
  std::__cxx11::stringstream::stringstream(local_1a0);
  poVar1 = std::operator<<(local_190,"Crypto System:");
  poVar1 = std::operator<<(poVar1,"\n\tEquipment:   ");
  ENUMS::GetEnumAsStringCryptoSystemType_abi_cxx11_
            (&local_1c0,(ENUMS *)(ulong)this->m_ui16CryptoSystemType,Value);
  poVar1 = std::operator<<(poVar1,(string *)&local_1c0);
  poVar1 = std::operator<<(poVar1,"\n\tMode:        ");
  ENUMS::GetEnumAsStringEncryptionMode_abi_cxx11_
            (&local_1e0,(ENUMS *)(ulong)((this->field_1).m_ui16CryptoKey & 1),Value_00);
  poVar1 = std::operator<<(poVar1,(string *)&local_1e0);
  poVar1 = std::operator<<(poVar1,"\n\tKey:         ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(this->field_1).m_ui16CryptoKey >> 1);
  std::operator<<(poVar1,"\n");
  std::__cxx11::string::~string((string *)&local_1e0);
  std::__cxx11::string::~string((string *)&local_1c0);
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1a0);
  return __return_storage_ptr__;
}

Assistant:

KString CryptoSystem::GetAsString() const
{
    KStringStream ss;

    ss << "Crypto System:"
       << "\n\tEquipment:   " << GetEnumAsStringCryptoSystemType( m_ui16CryptoSystemType )
       << "\n\tMode:        " << GetEnumAsStringEncryptionMode( m_ui16EncryptionMode )
       << "\n\tKey:         " << m_ui16KeyID
       << "\n";

    return ss.str();
}